

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::makeCooperativeMatrixTypeNV(Builder *this,Id component,Id scope,Id rows,Id cols)

{
  key_type kVar1;
  Id IVar2;
  mapped_type *pmVar3;
  size_type sVar4;
  reference ppIVar5;
  Instruction *this_00;
  value_type local_48;
  key_type local_40 [4];
  Instruction *pIStack_30;
  int t;
  Instruction *type;
  Id cols_local;
  Id rows_local;
  Id scope_local;
  Id component_local;
  Builder *this_local;
  
  local_40[3] = 0;
  type._0_4_ = cols;
  type._4_4_ = rows;
  cols_local = scope;
  rows_local = component;
  _scope_local = this;
  while( true ) {
    kVar1 = local_40[3];
    local_40[2] = 0x14ee;
    pmVar3 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedTypes,local_40 + 2);
    sVar4 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::size(pmVar3);
    if ((int)sVar4 <= (int)kVar1) {
      this_00 = (Instruction *)::operator_new(0x60);
      IVar2 = getUniqueId(this);
      spv::Instruction::Instruction(this_00,IVar2,0,OpTypeCooperativeMatrixNV);
      pIStack_30 = this_00;
      spv::Instruction::reserveOperands(this_00,4);
      spv::Instruction::addIdOperand(pIStack_30,rows_local);
      spv::Instruction::addIdOperand(pIStack_30,cols_local);
      spv::Instruction::addIdOperand(pIStack_30,type._4_4_);
      spv::Instruction::addIdOperand(pIStack_30,(Id)type);
      local_40[0] = 0x14ee;
      pmVar3 = std::
               unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
               ::operator[](&this->groupedTypes,local_40);
      std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::push_back
                (pmVar3,&stack0xffffffffffffffd0);
      std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
      unique_ptr<std::default_delete<spv::Instruction>,void>
                ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_48,
                 pIStack_30);
      std::
      vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ::push_back(&this->constantsTypesGlobals,&local_48);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_48);
      Module::mapInstruction(&this->module,pIStack_30);
      IVar2 = spv::Instruction::getResultId(pIStack_30);
      return IVar2;
    }
    local_40[1] = 0x14ee;
    pmVar3 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedTypes,local_40 + 1);
    ppIVar5 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::operator[]
                        (pmVar3,(long)(int)local_40[3]);
    pIStack_30 = *ppIVar5;
    IVar2 = spv::Instruction::getIdOperand(pIStack_30,0);
    if ((((IVar2 == rows_local) &&
         (IVar2 = spv::Instruction::getIdOperand(pIStack_30,1), IVar2 == cols_local)) &&
        (IVar2 = spv::Instruction::getIdOperand(pIStack_30,2), IVar2 == type._4_4_)) &&
       (IVar2 = spv::Instruction::getIdOperand(pIStack_30,3), IVar2 == (Id)type)) break;
    local_40[3] = local_40[3] + 1;
  }
  IVar2 = spv::Instruction::getResultId(pIStack_30);
  return IVar2;
}

Assistant:

Id Builder::makeCooperativeMatrixTypeNV(Id component, Id scope, Id rows, Id cols)
{
    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedTypes[OpTypeCooperativeMatrixNV].size(); ++t) {
        type = groupedTypes[OpTypeCooperativeMatrixNV][t];
        if (type->getIdOperand(0) == component && type->getIdOperand(1) == scope && type->getIdOperand(2) == rows &&
            type->getIdOperand(3) == cols)
            return type->getResultId();
    }

    // not found, make it
    type = new Instruction(getUniqueId(), NoType, OpTypeCooperativeMatrixNV);
    type->reserveOperands(4);
    type->addIdOperand(component);
    type->addIdOperand(scope);
    type->addIdOperand(rows);
    type->addIdOperand(cols);
    groupedTypes[OpTypeCooperativeMatrixNV].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    return type->getResultId();
}